

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovDevice.cpp
# Opt level: O1

cl_int cov::getDeviceIDs(cl_platform_id platform,cl_device_type deviceType,cl_uint numEntries,
                        cl_device_id *devices,cl_uint *numDevices)

{
  cl_int cVar1;
  
  if (numDevices != (cl_uint *)0x0) {
    *numDevices = 1;
  }
  cVar1 = 0;
  if ((numEntries != 0 && devices != (cl_device_id *)0x0) && (cVar1 = -6, g_device[9] == '\x01')) {
    *devices = (cl_device_id)g_device;
    cVar1 = 0;
  }
  return cVar1;
}

Assistant:

cl_int getDeviceIDs(cl_platform_id platform,
                    cl_device_type deviceType,
                    cl_uint numEntries,
                    cl_device_id* devices,
                    cl_uint* numDevices)
{
    auto p = reinterpret_cast<Platform*>(platform);
    if (numDevices) *numDevices = p->getNumDevices();
    if (!devices) return CL_SUCCESS;
    if (numEntries == 0) return CL_SUCCESS;

    if (!g_device.initSuccess()) return CL_OUT_OF_HOST_MEMORY;

    *devices = reinterpret_cast<_cl_device_id*>(&g_device);
    return CL_SUCCESS;
}